

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  Descriptor *this;
  undefined4 extraout_var;
  FieldDescriptor *pFVar7;
  ulong uVar8;
  size_type sVar9;
  reference ppFVar10;
  long *plVar11;
  int local_68;
  int j;
  int size;
  FieldDescriptor *field;
  int i_1;
  undefined1 local_48 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *message_local;
  long *plVar6;
  
  this = Message::GetDescriptor(message);
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  for (fields.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      iVar3 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      iVar4 = Descriptor::field_count(this), iVar3 < iVar4;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pFVar7 = Descriptor::field(this,fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar1 = FieldDescriptor::is_required(pFVar7);
    if (bVar1) {
      pFVar7 = Descriptor::field(this,fields.
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      uVar8 = (**(code **)(*plVar6 + 0x28))(plVar6,message,pFVar7);
      if ((uVar8 & 1) == 0) {
        return false;
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48);
  (**(code **)(*plVar6 + 0x60))
            (plVar6,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_48);
  field._0_4_ = 0;
  do {
    sVar9 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_48);
    if (sVar9 <= (ulong)(long)(int)field) {
      message_local._7_1_ = true;
LAB_002c0825:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
      return message_local._7_1_;
    }
    ppFVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_48,(long)(int)field);
    pFVar7 = *ppFVar10;
    CVar5 = FieldDescriptor::cpp_type(pFVar7);
    if (CVar5 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated(pFVar7);
      if (bVar1) {
        iVar3 = (**(code **)(*plVar6 + 0x30))(plVar6,message,pFVar7);
        for (local_68 = 0; local_68 < iVar3; local_68 = local_68 + 1) {
          plVar11 = (long *)(**(code **)(*plVar6 + 0x160))(plVar6,message,pFVar7,local_68);
          bVar2 = (**(code **)(*plVar11 + 0x28))();
          if ((bVar2 & 1) == 0) {
            message_local._7_1_ = false;
            goto LAB_002c0825;
          }
        }
      }
      else {
        plVar11 = (long *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,pFVar7,0);
        bVar2 = (**(code **)(*plVar11 + 0x28))();
        if ((bVar2 & 1) == 0) {
          message_local._7_1_ = false;
          goto LAB_002c0825;
        }
      }
    }
    field._0_4_ = (int)field + 1;
  } while( true );
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                          .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}